

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_kernel_test.cxx
# Opt level: O2

void compare_libxc_builtin(TestInterface interface,EvalType evaltype,Kernel kern,Spin polar)

{
  TestInterface TVar1;
  EvalType EVar2;
  byte bVar3;
  char cVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t npts;
  vector<double,_std::allocator<double>_> *this;
  size_type __n;
  ulong uVar8;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  XCKernel func_libxc;
  XCKernel func_builtin;
  vector<double,_std::allocator<double>_> rho_use;
  ExprLhs<double> local_3f0;
  TestInterface local_3e4;
  AssertionHandler catchAssertionHandler;
  vector<double,_std::allocator<double>_> sigma_use;
  size_t npts_lda;
  EvalType local_35c;
  vector<double,_std::allocator<double>_> lapl_use;
  vector<double,_std::allocator<double>_> exc_builtin;
  vector<double,_std::allocator<double>_> exc_libxc;
  vector<double,_std::allocator<double>_> tau_use;
  enable_if_t<Detail::conjunction<Detail::is_eq_comparable<double,_Approx>,_Detail::negation<capture_by_value<Detail::RemoveCVRef_t<Approx>_>_>_>::value,_BinaryExpr<double,_const_Approx_&>_>
  local_2e8;
  ScopedMessage scopedMessage62;
  vector<double,_std::allocator<double>_> vrho_builtin;
  vector<double,_std::allocator<double>_> vrho_libxc;
  vector<double,_std::allocator<double>_> ref_tau;
  vector<double,_std::allocator<double>_> ref_lapl;
  vector<double,_std::allocator<double>_> ref_sigma;
  vector<double,_std::allocator<double>_> ref_rho;
  vector<double,_std::allocator<double>_> vsigma_builtin;
  vector<double,_std::allocator<double>_> vsigma_libxc;
  size_t npts_lapl;
  size_t npts_mgga;
  size_t npts_gga;
  vector<double,_std::allocator<double>_> vtau_builtin;
  vector<double,_std::allocator<double>_> vlapl_builtin;
  vector<double,_std::allocator<double>_> vtau_libxc;
  vector<double,_std::allocator<double>_> vlapl_libxc;
  vector<double,_std::allocator<double>_> lapl_zero;
  vector<double,_std::allocator<double>_> sigma_zero;
  vector<double,_std::allocator<double>_> rho_zero;
  vector<double,_std::allocator<double>_> lapl_small;
  vector<double,_std::allocator<double>_> sigma_small;
  vector<double,_std::allocator<double>_> rho_small;
  vector<double,_std::allocator<double>_> tau_zero;
  vector<double,_std::allocator<double>_> tau_small;
  Approx local_50;
  
  ref_rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ref_rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ref_rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ref_sigma.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ref_sigma.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ref_sigma.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ref_lapl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ref_lapl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ref_lapl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ref_tau.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ref_tau.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ref_tau.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  load_reference_density
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)&catchAssertionHandler,
             polar);
  scopedMessage62.m_info.macroName.m_start = (char *)&ref_rho;
  scopedMessage62.m_info.macroName.m_size = (size_type)&npts_lda;
  std::tuple<unsigned_long&,std::vector<double,std::allocator<double>>&>::operator=
            ((tuple<unsigned_long&,std::vector<double,std::allocator<double>>&> *)&scopedMessage62,
             (pair<int,_std::vector<double,_std::allocator<double>_>_> *)&catchAssertionHandler);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &catchAssertionHandler.m_assertionInfo.macroName.m_size);
  load_reference_sigma
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)&catchAssertionHandler,
             polar);
  scopedMessage62.m_info.macroName.m_start = (char *)&ref_sigma;
  scopedMessage62.m_info.macroName.m_size = (size_type)&npts_gga;
  std::tuple<unsigned_long&,std::vector<double,std::allocator<double>>&>::operator=
            ((tuple<unsigned_long&,std::vector<double,std::allocator<double>>&> *)&scopedMessage62,
             (pair<int,_std::vector<double,_std::allocator<double>_>_> *)&catchAssertionHandler);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &catchAssertionHandler.m_assertionInfo.macroName.m_size);
  load_reference_lapl((pair<int,_std::vector<double,_std::allocator<double>_>_> *)
                      &catchAssertionHandler,polar);
  scopedMessage62.m_info.macroName.m_start = (char *)&ref_lapl;
  scopedMessage62.m_info.macroName.m_size = (size_type)&npts_lapl;
  std::tuple<unsigned_long&,std::vector<double,std::allocator<double>>&>::operator=
            ((tuple<unsigned_long&,std::vector<double,std::allocator<double>>&> *)&scopedMessage62,
             (pair<int,_std::vector<double,_std::allocator<double>_>_> *)&catchAssertionHandler);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &catchAssertionHandler.m_assertionInfo.macroName.m_size);
  load_reference_tau((pair<int,_std::vector<double,_std::allocator<double>_>_> *)
                     &catchAssertionHandler,polar);
  scopedMessage62.m_info.macroName.m_start = (char *)&ref_tau;
  scopedMessage62.m_info.macroName.m_size = (size_type)&npts_mgga;
  std::tuple<unsigned_long&,std::vector<double,std::allocator<double>>&>::operator=
            ((tuple<unsigned_long&,std::vector<double,std::allocator<double>>&> *)&scopedMessage62,
             (pair<int,_std::vector<double,_std::allocator<double>_>_> *)&catchAssertionHandler);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &catchAssertionHandler.m_assertionInfo.macroName.m_size);
  scopedMessage62.m_info.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
  ;
  scopedMessage62.m_info.macroName.m_size = 0x2ff;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x14;
  capturedExpression.m_start = "npts_lda == npts_gga";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&scopedMessage62,capturedExpression,
             Normal);
  scopedMessage62.m_info.macroName.m_size._0_2_ = CONCAT11(npts_lda == npts_gga,1);
  scopedMessage62.m_info.macroName.m_start = (char *)&PTR_streamReconstructedExpression_010e0940;
  scopedMessage62.m_info.message._M_dataplus._M_p = (pointer)npts_lda;
  scopedMessage62.m_info.message._M_string_length = (size_type)anon_var_dwarf_9a63;
  scopedMessage62.m_info.message.field_2._M_allocated_capacity = 2;
  scopedMessage62.m_info.message.field_2._8_8_ = npts_gga;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler,(ITransientExpression *)&scopedMessage62);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  scopedMessage62.m_info.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
  ;
  scopedMessage62.m_info.macroName.m_size = 0x300;
  macroName_00.m_size = 7;
  macroName_00.m_start = "REQUIRE";
  capturedExpression_00.m_size = 0x15;
  capturedExpression_00.m_start = "npts_lda == npts_mgga";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)&scopedMessage62,
             capturedExpression_00,Normal);
  scopedMessage62.m_info.macroName.m_size._0_2_ = CONCAT11(npts_lda == npts_mgga,1);
  scopedMessage62.m_info.macroName.m_start = (char *)&PTR_streamReconstructedExpression_010e0940;
  scopedMessage62.m_info.message._M_dataplus._M_p = (pointer)npts_lda;
  scopedMessage62.m_info.message._M_string_length = (size_type)anon_var_dwarf_9a63;
  scopedMessage62.m_info.message.field_2._M_allocated_capacity = 2;
  scopedMessage62.m_info.message.field_2._8_8_ = npts_mgga;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler,(ITransientExpression *)&scopedMessage62);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  scopedMessage62.m_info.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_kernel_test.cxx"
  ;
  scopedMessage62.m_info.macroName.m_size = 0x301;
  macroName_01.m_size = 7;
  macroName_01.m_start = "REQUIRE";
  capturedExpression_01.m_size = 0x15;
  capturedExpression_01.m_start = "npts_lda == npts_lapl";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)&scopedMessage62,
             capturedExpression_01,Normal);
  scopedMessage62.m_info.macroName.m_size._0_2_ = CONCAT11(npts_lda == npts_lapl,1);
  scopedMessage62.m_info.macroName.m_start = (char *)&PTR_streamReconstructedExpression_010e0940;
  scopedMessage62.m_info.message._M_dataplus._M_p = (pointer)npts_lda;
  scopedMessage62.m_info.message._M_string_length = (size_type)anon_var_dwarf_9a63;
  scopedMessage62.m_info.message.field_2._M_allocated_capacity = 2;
  scopedMessage62.m_info.message.field_2._8_8_ = npts_lapl;
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler,(ITransientExpression *)&scopedMessage62);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  ExchCXX::XCKernel::XCKernel(&func_libxc,libxc,kern,polar);
  local_3e4 = interface;
  ExchCXX::XCKernel::XCKernel(&func_builtin,builtin,kern,polar);
  npts = (size_t)(int)npts_lda;
  local_35c = evaltype;
  bVar3 = (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                                super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                _M_head_impl + 0x38))();
  sVar5 = ExchCXX::detail::XCKernelImpl::sigma_buffer_len
                    ((XCKernelImpl *)
                     func_libxc.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts);
  sVar6 = ExchCXX::detail::XCKernelImpl::lapl_buffer_len
                    ((XCKernelImpl *)
                     func_libxc.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts);
  sVar7 = ExchCXX::detail::XCKernelImpl::tau_buffer_len
                    ((XCKernelImpl *)
                     func_libxc.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts);
  __n = (size_type)(int)(npts_lda << (bVar3 & 0x3f));
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x3d3c25c268497682;
  std::vector<double,_std::allocator<double>_>::vector
            (&rho_small,__n,(value_type_conflict1 *)&catchAssertionHandler,
             (allocator_type *)&scopedMessage62);
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x3d06849b86a12b9b;
  std::vector<double,_std::allocator<double>_>::vector
            (&sigma_small,(long)(int)sVar5,(value_type_conflict1 *)&catchAssertionHandler,
             (allocator_type *)&scopedMessage62);
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x3d06849b86a12b9b;
  std::vector<double,_std::allocator<double>_>::vector
            (&lapl_small,(long)(int)sVar6,(value_type_conflict1 *)&catchAssertionHandler,
             (allocator_type *)&scopedMessage62);
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x3d06849b86a12b9b;
  std::vector<double,_std::allocator<double>_>::vector
            (&tau_small,(long)(int)sVar7,(value_type_conflict1 *)&catchAssertionHandler,
             (allocator_type *)&scopedMessage62);
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&rho_zero,__n,(value_type_conflict1 *)&catchAssertionHandler,
             (allocator_type *)&scopedMessage62);
  EVar2 = local_35c;
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&sigma_zero,(long)(int)sVar5,(value_type_conflict1 *)&catchAssertionHandler,
             (allocator_type *)&scopedMessage62);
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&lapl_zero,(long)(int)sVar6,(value_type_conflict1 *)&catchAssertionHandler,
             (allocator_type *)&scopedMessage62);
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x0;
  this = &tau_zero;
  std::vector<double,_std::allocator<double>_>::vector
            (this,(long)(int)sVar7,(value_type_conflict1 *)&catchAssertionHandler,
             (allocator_type *)&scopedMessage62);
  TVar1 = local_3e4;
  rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lapl_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  lapl_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lapl_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tau_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tau_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tau_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (EVar2 == Zero) {
    std::vector<double,_std::allocator<double>_>::operator=(&rho_use,&rho_zero);
    std::vector<double,_std::allocator<double>_>::operator=(&sigma_use,&sigma_zero);
    std::vector<double,_std::allocator<double>_>::operator=(&lapl_use,&lapl_zero);
  }
  else if (EVar2 == Small) {
    std::vector<double,_std::allocator<double>_>::operator=(&rho_use,&rho_small);
    std::vector<double,_std::allocator<double>_>::operator=(&sigma_use,&sigma_small);
    std::vector<double,_std::allocator<double>_>::operator=(&lapl_use,&lapl_small);
    this = &tau_small;
  }
  else {
    if (EVar2 != Regular) goto LAB_00164854;
    std::vector<double,_std::allocator<double>_>::operator=(&rho_use,&ref_rho);
    std::vector<double,_std::allocator<double>_>::operator=(&sigma_use,&ref_sigma);
    std::vector<double,_std::allocator<double>_>::operator=(&lapl_use,&ref_lapl);
    this = &ref_tau;
  }
  std::vector<double,_std::allocator<double>_>::operator=(&tau_use,this);
LAB_00164854:
  std::vector<double,_std::allocator<double>_>::vector
            (&exc_libxc,npts,(allocator_type *)&catchAssertionHandler);
  bVar3 = (**(code **)(*(long *)func_builtin.pimpl_._M_t.
                                super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                _M_head_impl + 0x38))();
  std::vector<double,_std::allocator<double>_>::vector
            (&vrho_libxc,npts << (bVar3 & 0x3f),(allocator_type *)&catchAssertionHandler);
  sVar5 = ExchCXX::detail::XCKernelImpl::sigma_buffer_len
                    ((XCKernelImpl *)
                     func_builtin.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts);
  std::vector<double,_std::allocator<double>_>::vector
            (&vsigma_libxc,sVar5,(allocator_type *)&catchAssertionHandler);
  sVar5 = ExchCXX::detail::XCKernelImpl::lapl_buffer_len
                    ((XCKernelImpl *)
                     func_builtin.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts);
  std::vector<double,_std::allocator<double>_>::vector
            (&vlapl_libxc,sVar5,(allocator_type *)&catchAssertionHandler);
  sVar5 = ExchCXX::detail::XCKernelImpl::tau_buffer_len
                    ((XCKernelImpl *)
                     func_builtin.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts);
  std::vector<double,_std::allocator<double>_>::vector
            (&vtau_libxc,sVar5,(allocator_type *)&catchAssertionHandler);
  std::vector<double,_std::allocator<double>_>::vector
            (&exc_builtin,npts,(allocator_type *)&catchAssertionHandler);
  bVar3 = (**(code **)(*(long *)func_builtin.pimpl_._M_t.
                                super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                _M_head_impl + 0x38))();
  std::vector<double,_std::allocator<double>_>::vector
            (&vrho_builtin,npts << (bVar3 & 0x3f),(allocator_type *)&catchAssertionHandler);
  sVar5 = ExchCXX::detail::XCKernelImpl::sigma_buffer_len
                    ((XCKernelImpl *)
                     func_builtin.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts);
  std::vector<double,_std::allocator<double>_>::vector
            (&vsigma_builtin,sVar5,(allocator_type *)&catchAssertionHandler);
  sVar5 = ExchCXX::detail::XCKernelImpl::lapl_buffer_len
                    ((XCKernelImpl *)
                     func_builtin.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts);
  std::vector<double,_std::allocator<double>_>::vector
            (&vlapl_builtin,sVar5,(allocator_type *)&catchAssertionHandler);
  sVar5 = ExchCXX::detail::XCKernelImpl::tau_buffer_len
                    ((XCKernelImpl *)
                     func_builtin.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts);
  std::vector<double,_std::allocator<double>_>::vector
            (&vtau_builtin,sVar5,(allocator_type *)&catchAssertionHandler);
  cVar4 = (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                                super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                _M_head_impl + 0x18))();
  if (cVar4 == '\0') {
    cVar4 = (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                  _M_head_impl + 0x20))();
    if (cVar4 == '\0') {
      cVar4 = (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                                    super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                    _M_head_impl + 0x28))();
      if (cVar4 != '\0') {
        if (TVar1 == EXC_VXC) {
          (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                                super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                _M_head_impl + 0xb0))
                    (func_libxc.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts_lda & 0xffffffff,
                     rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     lapl_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     tau_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     exc_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     vrho_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     vsigma_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     vlapl_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     vtau_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          (**(code **)(*(long *)func_builtin.pimpl_._M_t.
                                super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                _M_head_impl + 0xb0))
                    (func_builtin.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts_lda & 0xffffffff,
                     rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     lapl_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     tau_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     exc_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     vrho_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     vsigma_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     vlapl_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     vtau_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
        else if (TVar1 == EXC) {
          (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                                super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                _M_head_impl + 0xa8))
                    (func_libxc.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts_lda & 0xffffffff,
                     rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     lapl_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     tau_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     exc_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          (**(code **)(*(long *)func_builtin.pimpl_._M_t.
                                super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                _M_head_impl + 0xa8))
                    (func_builtin.pimpl_._M_t.
                     super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                     .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                     npts_lda & 0xffffffff,
                     rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     lapl_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     tau_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     exc_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
      }
    }
    else if (TVar1 == EXC_VXC) {
      (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                            super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                            _M_head_impl + 0x90))
                (func_libxc.pimpl_._M_t.
                 super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                 npts_lda & 0xffffffff,
                 rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 exc_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vrho_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vsigma_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(*(long *)func_builtin.pimpl_._M_t.
                            super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                            _M_head_impl + 0x90))
                (func_builtin.pimpl_._M_t.
                 super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                 npts_lda & 0xffffffff,
                 rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 exc_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vrho_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vsigma_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    else if (TVar1 == EXC) {
      (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                            super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                            _M_head_impl + 0x88))
                (func_libxc.pimpl_._M_t.
                 super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                 npts_lda & 0xffffffff,
                 rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 exc_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(*(long *)func_builtin.pimpl_._M_t.
                            super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                            _M_head_impl + 0x88))
                (func_builtin.pimpl_._M_t.
                 super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
                 npts_lda & 0xffffffff,
                 rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 sigma_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 exc_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
  }
  else if (TVar1 == EXC_VXC) {
    (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                          super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                          .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                          _M_head_impl + 0x70))
              (func_libxc.pimpl_._M_t.
               super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
               npts_lda & 0xffffffff,
               rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               exc_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               vrho_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    (**(code **)(*(long *)func_builtin.pimpl_._M_t.
                          super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                          .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                          _M_head_impl + 0x70))
              (func_builtin.pimpl_._M_t.
               super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
               npts_lda & 0xffffffff,
               rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               exc_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               vrho_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  else if (TVar1 == EXC) {
    (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                          super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                          .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                          _M_head_impl + 0x68))
              (func_libxc.pimpl_._M_t.
               super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
               npts_lda & 0xffffffff,
               rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               exc_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    (**(code **)(*(long *)func_builtin.pimpl_._M_t.
                          super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                          .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                          _M_head_impl + 0x68))
              (func_builtin.pimpl_._M_t.
               super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,
               npts_lda & 0xffffffff,
               rho_use.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               exc_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  for (sVar5 = 0; npts != sVar5; sVar5 = sVar5 + 1) {
    local_2e8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0xffe190;
    local_2e8.super_ITransientExpression.m_isBinaryExpression = true;
    local_2e8.super_ITransientExpression.m_result = true;
    local_2e8.super_ITransientExpression._10_6_ = 0;
    macroName_02.m_size = 4;
    macroName_02.m_start = "INFO";
    Catch::MessageBuilder::MessageBuilder
              ((MessageBuilder *)&catchAssertionHandler,macroName_02,(SourceLineInfo *)&local_2e8,
               Info);
    std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,
                    "EXC Fails: Kernel is ");
    ExchCXX::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,kern);
    Catch::ScopedMessage::ScopedMessage(&scopedMessage62,(MessageBuilder *)&catchAssertionHandler);
    Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
    local_2e8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0xffe190;
    local_2e8.super_ITransientExpression.m_isBinaryExpression = true;
    local_2e8.super_ITransientExpression.m_result = true;
    local_2e8.super_ITransientExpression._10_6_ = 0;
    macroName_03.m_size = 5;
    macroName_03.m_start = "CHECK";
    capturedExpression_02.m_size = 0x26;
    capturedExpression_02.m_start = "exc_builtin[i] == Approx(exc_libxc[i])";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_03,(SourceLineInfo *)&local_2e8,
               capturedExpression_02,ContinueOnFailure);
    local_3f0.m_lhs =
         exc_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[sVar5];
    Catch::Approx::Approx
              (&local_50,
               exc_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[sVar5]);
    Catch::operator==(&local_2e8,&local_3f0,&local_50);
    Catch::AssertionHandler::handleExpr
              (&catchAssertionHandler,&local_2e8.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    Catch::ScopedMessage::~ScopedMessage(&scopedMessage62);
  }
  if (local_3e4 == EXC_VXC) {
    uVar8 = 0;
    while( true ) {
      bVar3 = (**(code **)(*(long *)func_libxc.pimpl_._M_t.
                                    super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                                    _M_head_impl + 0x38))();
      if (npts << (bVar3 & 0x3f) <= uVar8) break;
      local_2e8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0xffe190;
      local_2e8.super_ITransientExpression.m_isBinaryExpression = true;
      local_2e8.super_ITransientExpression.m_result = true;
      local_2e8.super_ITransientExpression._10_6_ = 0;
      macroName_04.m_size = 4;
      macroName_04.m_start = "INFO";
      Catch::MessageBuilder::MessageBuilder
                ((MessageBuilder *)&catchAssertionHandler,macroName_04,(SourceLineInfo *)&local_2e8,
                 Info);
      std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,
                      "VRHO Fails: Kernel is ");
      ExchCXX::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,kern);
      Catch::ScopedMessage::ScopedMessage(&scopedMessage62,(MessageBuilder *)&catchAssertionHandler)
      ;
      Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
      local_2e8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0xffe190;
      local_2e8.super_ITransientExpression.m_isBinaryExpression = true;
      local_2e8.super_ITransientExpression.m_result = true;
      local_2e8.super_ITransientExpression._10_6_ = 0;
      macroName_05.m_size = 5;
      macroName_05.m_start = "CHECK";
      capturedExpression_03.m_size = 0x28;
      capturedExpression_03.m_start = "vrho_builtin[i] == Approx(vrho_libxc[i])";
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,macroName_05,(SourceLineInfo *)&local_2e8,
                 capturedExpression_03,ContinueOnFailure);
      local_3f0.m_lhs =
           vrho_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8];
      Catch::Approx::Approx
                (&local_50,
                 vrho_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8]);
      Catch::operator==(&local_2e8,&local_3f0,&local_50);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_2e8.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      Catch::ScopedMessage::~ScopedMessage(&scopedMessage62);
      uVar8 = uVar8 + 1;
    }
    uVar8 = 0;
    while( true ) {
      sVar5 = ExchCXX::detail::XCKernelImpl::sigma_buffer_len
                        ((XCKernelImpl *)
                         func_libxc.pimpl_._M_t.
                         super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                         .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl
                         ,npts);
      if (sVar5 <= uVar8) break;
      local_2e8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0xffe190;
      local_2e8.super_ITransientExpression.m_isBinaryExpression = true;
      local_2e8.super_ITransientExpression.m_result = true;
      local_2e8.super_ITransientExpression._10_6_ = 0;
      macroName_06.m_size = 4;
      macroName_06.m_start = "INFO";
      Catch::MessageBuilder::MessageBuilder
                ((MessageBuilder *)&catchAssertionHandler,macroName_06,(SourceLineInfo *)&local_2e8,
                 Info);
      std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,
                      "VSIGMA Fails: Kernel is ");
      ExchCXX::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,kern);
      Catch::ScopedMessage::ScopedMessage(&scopedMessage62,(MessageBuilder *)&catchAssertionHandler)
      ;
      Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
      local_2e8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0xffe190;
      local_2e8.super_ITransientExpression.m_isBinaryExpression = true;
      local_2e8.super_ITransientExpression.m_result = true;
      local_2e8.super_ITransientExpression._10_6_ = 0;
      macroName_07.m_size = 5;
      macroName_07.m_start = "CHECK";
      capturedExpression_04.m_size = 0x2c;
      capturedExpression_04.m_start = "vsigma_builtin[i] == Approx(vsigma_libxc[i])";
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,macroName_07,(SourceLineInfo *)&local_2e8,
                 capturedExpression_04,ContinueOnFailure);
      local_3f0.m_lhs =
           vsigma_builtin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8];
      Catch::Approx::Approx
                (&local_50,
                 vsigma_libxc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8]);
      Catch::operator==(&local_2e8,&local_3f0,&local_50);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_2e8.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      Catch::ScopedMessage::~ScopedMessage(&scopedMessage62);
      uVar8 = uVar8 + 1;
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vtau_builtin.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vlapl_builtin.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vsigma_builtin.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vrho_builtin.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&exc_builtin.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vtau_libxc.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vlapl_libxc.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vsigma_libxc.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vrho_libxc.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&exc_libxc.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tau_use.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lapl_use.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&sigma_use.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rho_use.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tau_zero.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lapl_zero.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&sigma_zero.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rho_zero.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tau_small.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lapl_small.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&sigma_small.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rho_small.super__Vector_base<double,_std::allocator<double>_>);
  ExchCXX::XCKernel::~XCKernel(&func_builtin);
  ExchCXX::XCKernel::~XCKernel(&func_libxc);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ref_tau.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ref_lapl.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ref_sigma.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ref_rho.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void compare_libxc_builtin( TestInterface interface, EvalType evaltype,
  Kernel kern, Spin polar ) {

  size_t npts_lda, npts_gga, npts_mgga, npts_lapl;
  std::vector<double> ref_rho, ref_sigma, ref_lapl, ref_tau;
  std::tie(npts_lda, ref_rho  )  = load_reference_density( polar );
  std::tie(npts_gga, ref_sigma)  = load_reference_sigma  ( polar );
  std::tie(npts_lapl, ref_lapl)  = load_reference_lapl   ( polar );
  std::tie(npts_mgga, ref_tau)   = load_reference_tau    ( polar );

  REQUIRE( npts_lda == npts_gga );
  REQUIRE( npts_lda == npts_mgga );
  REQUIRE( npts_lda == npts_lapl );

  const int npts = npts_lda;

  XCKernel func_libxc  ( Backend::libxc,   kern, polar );
  XCKernel func_builtin( Backend::builtin, kern, polar );


  const int len_rho   = func_libxc.rho_buffer_len( npts );
  const int len_sigma = func_libxc.sigma_buffer_len( npts );
  const int len_lapl = func_libxc.lapl_buffer_len( npts );
  const int len_tau = func_libxc.tau_buffer_len( npts );

  std::vector<double> rho_small(len_rho, 1e-13);
  std::vector<double> sigma_small(len_sigma, 1e-14);
  std::vector<double> lapl_small(len_lapl, 1e-14);
  std::vector<double> tau_small(len_tau, 1e-14);

  std::vector<double> rho_zero(len_rho, 0.);
  std::vector<double> sigma_zero(len_sigma, 0.);
  std::vector<double> lapl_zero(len_lapl, 0.);
  std::vector<double> tau_zero(len_tau, 0.);

  std::vector<double> rho_use, sigma_use, lapl_use, tau_use;

  if( evaltype == EvalType::Regular ) {
    rho_use   = ref_rho;
    sigma_use = ref_sigma;
    lapl_use = ref_lapl;
    tau_use = ref_tau;
  }

  if( evaltype == EvalType::Small ) {
    rho_use   = rho_small;
    sigma_use = sigma_small;
    lapl_use = lapl_small;
    tau_use = tau_small;
  }

  if( evaltype == EvalType::Zero ) {
    rho_use   = rho_zero;
    sigma_use = sigma_zero;
    lapl_use = lapl_zero;
    tau_use = tau_zero;
  }



  std::vector<double> exc_libxc( func_builtin.exc_buffer_len(npts) );
  std::vector<double> vrho_libxc( func_builtin.vrho_buffer_len(npts) );
  std::vector<double> vsigma_libxc( func_builtin.vsigma_buffer_len(npts) );
  std::vector<double> vlapl_libxc( func_builtin.vlapl_buffer_len(npts) );
  std::vector<double> vtau_libxc( func_builtin.vtau_buffer_len(npts) );

  std::vector<double> exc_builtin( func_builtin.exc_buffer_len(npts) );
  std::vector<double> vrho_builtin( func_builtin.vrho_buffer_len(npts) );
  std::vector<double> vsigma_builtin( func_builtin.vsigma_buffer_len(npts) );
  std::vector<double> vlapl_builtin( func_builtin.vlapl_buffer_len(npts) );
  std::vector<double> vtau_builtin( func_builtin.vtau_buffer_len(npts) );

  if( func_libxc.is_lda() ) {

    if( interface == TestInterface::EXC ) {

      func_libxc.eval_exc( npts, rho_use.data(), exc_libxc.data() );
      func_builtin.eval_exc( npts, rho_use.data(), exc_builtin.data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      func_libxc.eval_exc_vxc( npts, rho_use.data(), exc_libxc.data(),
        vrho_libxc.data() );
      func_builtin.eval_exc_vxc( npts, rho_use.data(), exc_builtin.data(),
        vrho_builtin.data() );

    }

  } else if( func_libxc.is_gga() ) {

    if( interface == TestInterface::EXC ) {

      func_libxc.eval_exc( npts, rho_use.data(), sigma_use.data(),
        exc_libxc.data() );
      func_builtin.eval_exc( npts, rho_use.data(), sigma_use.data(),
        exc_builtin.data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      func_libxc.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        exc_libxc.data(), vrho_libxc.data(), vsigma_libxc.data() );
      func_builtin.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        exc_builtin.data(), vrho_builtin.data(), vsigma_builtin.data() );

    }

  } else if( func_libxc.is_mgga() ) {

    if( interface == TestInterface::EXC ) {

      func_libxc.eval_exc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_libxc.data() );
      func_builtin.eval_exc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_builtin.data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      func_libxc.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_libxc.data(), vrho_libxc.data(), vsigma_libxc.data(), vlapl_libxc.data(), vtau_libxc.data() );
      func_builtin.eval_exc_vxc( npts, rho_use.data(), sigma_use.data(),
        lapl_use.data(), tau_use.data(), exc_builtin.data(), vrho_builtin.data(), vsigma_builtin.data(), vlapl_builtin.data(), vtau_builtin.data() );

    }

  }

  // Check correctness
  for( auto i = 0ul; i < func_libxc.exc_buffer_len(npts); ++i ) {
    INFO( "EXC Fails: Kernel is " << kern );
    CHECK( exc_builtin[i] == Approx(exc_libxc[i]) );
  }

  if( interface == TestInterface::EXC_VXC ) {
    for( auto i = 0ul; i < func_libxc.vrho_buffer_len(npts); ++i ) {
      INFO( "VRHO Fails: Kernel is " << kern );
      CHECK( vrho_builtin[i] == Approx(vrho_libxc[i]) );
    }
    for( auto i = 0ul; i < func_libxc.vsigma_buffer_len(npts); ++i ) {
      INFO( "VSIGMA Fails: Kernel is " << kern );
      CHECK( vsigma_builtin[i] == Approx(vsigma_libxc[i]) );
    }
  }

}